

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool saveKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *keyPresses)

{
  long lVar1;
  int i;
  long lVar2;
  int n;
  ofstream fout;
  
  std::ofstream::ofstream(&fout,(string *)fname,_S_bin);
  n = (int)(((long)(keyPresses->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  std::ostream::write((char *)&fout,(long)&n);
  lVar1 = 0x10;
  for (lVar2 = 0; lVar2 < n; lVar2 = lVar2 + 1) {
    std::ostream::write((char *)&fout,
                        (long)&(((keyPresses->
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ).
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->waveform).samples +
                        lVar1);
    lVar1 = lVar1 + 0x30;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&fout);
  return true;
}

Assistant:

bool saveKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & keyPresses) {
    std::ofstream fout(fname, std::ios::binary);
    int n = keyPresses.size();
    fout.write((char *)(&n), sizeof(n));
    for (int i = 0; i < n; ++i) {
        fout.write((char *)(&keyPresses[i].pos), sizeof(keyPresses[i].pos));
    }
    fout.close();

    return true;
}